

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Create_irreg64(int type,int ndim,int64_t *dims,char *name,int64_t *block,int64_t *map)

{
  ulong uVar1;
  Integer *pIVar2;
  logical lVar3;
  int iVar4;
  ulong ndim_00;
  Integer g_a;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  Integer local_b0 [8];
  int64_t iStack_70;
  Integer local_68 [7];
  
  if (7 < ndim) {
    return 0;
  }
  if (0 < ndim) {
    ndim_00 = (ulong)(uint)ndim;
    uVar1 = ndim_00;
    do {
      (&iStack_70)[uVar1] = *dims;
      dims = dims + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    uVar1 = ndim_00;
    pIVar2 = block;
    if (0 < ndim) {
      do {
        local_b0[uVar1] = *pIVar2;
        uVar1 = uVar1 - 1;
        pIVar2 = pIVar2 + 1;
      } while (uVar1 != 0);
      goto LAB_00104573;
    }
  }
  ndim_00 = (ulong)ndim;
LAB_00104573:
  pIVar2 = copy_map64(block,ndim,map);
  _ga_irreg_flag = 1;
  lVar3 = pnga_create_irreg((long)type,ndim_00,local_68,name,pIVar2,local_b0 + 1,local_b0);
  _ga_irreg_flag = 0;
  free(pIVar2);
  iVar4 = 0;
  if (lVar3 == 1) {
    iVar4 = (int)local_b0[0];
  }
  return iVar4;
}

Assistant:

int NGA_Create_irreg64(int type,int ndim,int64_t dims[],char *name,int64_t block[],int64_t map[])
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map64(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_irreg(type, (Integer)ndim, _ga_dims, name, _ga_map_capi,
            _ga_work, &g_a);
    _ga_irreg_flag = 0; /* unset it after creating the array */

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}